

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

float __thiscall
notch::core::SoftmaxWithLoss::output(SoftmaxWithLoss *this,Array *actual,Array *expected)

{
  float fVar1;
  size_t i;
  ulong uVar2;
  float fVar3;
  float fVar4;
  element_type *local_20;
  
  if (this->nSize != actual->_M_size) {
    __assert_fail("nSize == actual.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                  ,0x7e3,
                  "virtual float notch::SoftmaxWithLoss::output(const Array &, const Array &)");
  }
  if (this->nSize == expected->_M_size) {
    softmax((SoftmaxWithLoss *)&stack0xffffffffffffffd8,actual);
    std::valarray<float>::operator=
              (&this->softmaxOutput,(valarray<float> *)&stack0xffffffffffffffd8);
    operator_delete(local_20);
    fVar4 = 0.0;
    for (uVar2 = 0; uVar2 < this->nSize; uVar2 = uVar2 + 1) {
      fVar1 = expected->_M_data[uVar2];
      fVar3 = logf((this->softmaxOutput)._M_data[uVar2]);
      fVar4 = fVar4 - fVar3 * fVar1;
      (this->lossGrad)._M_data[uVar2] =
           expected->_M_data[uVar2] - (this->softmaxOutput)._M_data[uVar2];
    }
    return fVar4;
  }
  __assert_fail("nSize == expected.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                ,0x7e4,"virtual float notch::SoftmaxWithLoss::output(const Array &, const Array &)")
  ;
}

Assistant:

virtual float output(const Array &actual, const Array &expected) {
        float lossTotal = 0.0;
        assert (nSize == actual.size());
        assert (nSize == expected.size());
        softmaxOutput = softmax(actual);
        for (size_t i = 0; i < nSize; ++i) {
            // accumulate loss across all class labels
            lossTotal -= expected[i] * std::log(softmaxOutput[i]);
            // combination of softmax activation with cross-entropy loss
            // allows to simplify loss gradient calculation:
            //
            // $$ \\grad_y E = d - \\phi(y)$$
            lossGrad[i] = expected[i] - softmaxOutput[i];
        }
        return lossTotal;
    }